

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingState<signed_char,_signed_char>::Reset
          (BitpackingState<signed_char,_signed_char> *this)

{
  char cVar1;
  long in_RDI;
  
  cVar1 = NumericLimits<signed_char>::Maximum();
  *(char *)(in_RDI + 0x1828) = cVar1;
  cVar1 = NumericLimits<signed_char>::Maximum();
  *(char *)(in_RDI + 0x182b) = cVar1;
  cVar1 = NumericLimits<signed_char>::Minimum();
  *(char *)(in_RDI + 0x1829) = cVar1;
  cVar1 = NumericLimits<signed_char>::Minimum();
  *(char *)(in_RDI + 0x182c) = cVar1;
  *(undefined1 *)(in_RDI + 0x182e) = 0;
  *(undefined1 *)(in_RDI + 0x182f) = 1;
  *(undefined1 *)(in_RDI + 0x1830) = 1;
  *(undefined1 *)(in_RDI + 0x1831) = 0;
  *(undefined1 *)(in_RDI + 0x1832) = 0;
  *(undefined8 *)(in_RDI + 0x1810) = 0;
  *(undefined1 *)(in_RDI + 0x182a) = 0;
  *(undefined1 *)(in_RDI + 0x182d) = 0;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}